

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableStringOneofFieldGenerator::GenerateParsingCode
          (ImmutableStringOneofFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Printer *printer_local;
  ImmutableStringOneofFieldGenerator *this_local;
  
  bVar1 = CheckUtf8((this->super_ImmutableStringFieldGenerator).descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,&(this->super_ImmutableStringFieldGenerator).variables_,
                       "java.lang.String s = input.readStringRequireUtf8();\n$set_oneof_case_message$;\n$oneof_name$_ = s;\n"
                      );
  }
  else {
    io::Printer::Print(printer,&(this->super_ImmutableStringFieldGenerator).variables_,
                       "com.google.protobuf.ByteString bs = input.readBytes();\n$set_oneof_case_message$;\n$oneof_name$_ = bs;\n"
                      );
  }
  return;
}

Assistant:

void ImmutableStringOneofFieldGenerator::
GenerateParsingCode(io::Printer* printer) const {
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_,
      "java.lang.String s = input.readStringRequireUtf8();\n"
      "$set_oneof_case_message$;\n"
      "$oneof_name$_ = s;\n");
  } else {
    printer->Print(variables_,
      "com.google.protobuf.ByteString bs = input.readBytes();\n"
      "$set_oneof_case_message$;\n"
      "$oneof_name$_ = bs;\n");
  }
}